

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O2

char * cmime_flbi_scan_postface(char *s,CMimeMessage_T *msg)

{
  size_t sVar1;
  CMimeListElem_T *pCVar2;
  void *pvVar3;
  int iVar4;
  _BoundaryInfo_T *__ptr;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  _BoundaryInfo_T *__ptr_00;
  CMimeListElem_T **ppCVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  char *local_60;
  int local_58;
  char *local_38;
  
  local_60 = (char *)0x0;
  iVar10 = 0;
  local_38 = s;
  do {
    local_38 = strstr(local_38,"--");
    if (local_38 == (char *)0x0) {
      if (local_60 == (char *)0x0) {
        pcVar7 = strdup(s);
        return pcVar7;
      }
      return local_60;
    }
    __ptr = _cmime_internal_get_boundary_info(msg->boundaries,local_38,msg->linebreak);
    if (__ptr != (_BoundaryInfo_T *)0x0) {
      if (__ptr->type == CMIME_BOUNDARY_CLOSE) {
        if (iVar10 == 0) {
          sVar5 = strlen(s);
          sVar6 = strlen(local_38);
          sVar5 = (size_t)((int)sVar5 - (int)sVar6);
          local_60 = (char *)calloc(sVar5 + 1,1);
          strncpy(local_60,s,sVar5);
          sVar5 = strlen(local_60);
          local_60[sVar5] = '\0';
          iVar10 = 1;
        }
        pcVar9 = local_38 + __ptr->len;
        pcVar7 = strstr(pcVar9,"--");
        if (pcVar7 == (char *)0x0) {
          sVar5 = strlen(s);
          sVar6 = strlen(pcVar9);
          local_58 = (int)sVar5 - (int)sVar6;
          local_38 = pcVar9;
        }
        else {
          __ptr_00 = _cmime_internal_get_boundary_info(msg->boundaries,pcVar7,msg->linebreak);
          if (__ptr_00 == (_BoundaryInfo_T *)0x0) {
            sVar5 = strlen(s);
            sVar6 = strlen(local_38);
            local_58 = (int)sVar5 - (int)sVar6;
          }
          else {
            sVar1 = __ptr_00->len;
            sVar5 = strlen(local_38 + sVar1);
            sVar6 = strlen(pcVar7);
            local_58 = (int)sVar5 - (int)sVar6;
            free(__ptr_00->marker);
            free(__ptr_00);
            local_38 = local_38 + sVar1;
          }
        }
        pcVar7 = __ptr->marker;
        ppCVar8 = &msg->parts->tail;
        while (pCVar2 = *ppCVar8, pCVar2 != (CMimeListElem_T *)0x0) {
          pvVar3 = pCVar2->data;
          pcVar9 = *(char **)((long)pvVar3 + 0x18);
          if (pcVar9 != (char *)0x0) {
            sVar5 = strlen(pcVar9);
            iVar4 = strncmp(pcVar9,pcVar7 + 2,sVar5);
            bVar11 = iVar4 == 0;
            pcVar9 = *(char **)((long)pvVar3 + 0x10);
            if (pcVar9 != (char *)0x0) goto LAB_00106189;
            if (iVar4 != 0) goto LAB_001061a7;
LAB_001061be:
            free(*(void **)((long)pvVar3 + 0x20));
            pcVar7 = (char *)calloc((long)local_58 + 1,1);
            strncpy(pcVar7,local_38,(long)local_58);
            sVar5 = strlen(pcVar7);
            pcVar7[sVar5] = '\0';
            *(char **)((long)pvVar3 + 0x20) = pcVar7;
            *(undefined2 *)((long)pvVar3 + 0x28) = 1;
            break;
          }
          pcVar9 = *(char **)((long)pvVar3 + 0x10);
          if (pcVar9 != (char *)0x0) {
            bVar11 = false;
LAB_00106189:
            sVar5 = strlen(pcVar9);
            iVar4 = strncmp(pcVar9,pcVar7 + 2,sVar5);
            if ((iVar4 == 0) || (bVar11)) goto LAB_001061be;
          }
LAB_001061a7:
          ppCVar8 = &pCVar2->prev;
        }
      }
      iVar10 = iVar10 + 1;
      free(__ptr->marker);
      free(__ptr);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

char *cmime_flbi_scan_postface(char *s, CMimeMessage_T *msg) {
    char *it = s;
    _BoundaryInfo_T *info = NULL;
    char *boundary;
    char *postface = NULL;
    char *nxt = NULL;
    _BoundaryInfo_T *nxt_info = NULL;
    char *t = NULL;
    int count;
    int offset = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *part = NULL;
    int match = 0;

    count = 0;
    while((it = strstr(it,"--"))!=NULL) {
        info = _cmime_internal_get_boundary_info(msg->boundaries,it,msg->linebreak);
        if (info!=NULL) {
            //len = strlen(marker);
            //if ((marker[len-2]=='-')&&(marker[len-1]=='-')) {
            if (info->type == CMIME_BOUNDARY_CLOSE) {
                if (count == 0) {
                    offset = strlen(s) - strlen(it);
                    postface = (char *)calloc(offset + sizeof(char),sizeof(char));
                    strncpy(postface,s,offset);
                    postface[strlen(postface)] = '\0';
                    count++;
                } 
                nxt = it + info->len;
                if ((nxt = strstr(nxt,"--"))!=NULL) { 
                    if ((nxt_info = _cmime_internal_get_boundary_info(msg->boundaries,nxt,msg->linebreak))!=NULL) {  
                        it = it + nxt_info->len;
                        offset = strlen(it) - strlen(nxt); 
                        free(nxt_info->marker);
                        free(nxt_info);
                        nxt_info = NULL;
                    } else
                        offset = strlen(s) - strlen(it);
                } else {
                    it = it + info->len;
                    offset = strlen(s) - strlen(it);
                }

                /* jump over 2 starting - chars for boundary comparsion */
                boundary = info->marker;
                boundary += 2 * sizeof(char);
                /* find mime part which belongs to this boundary */
                elem = cmime_list_tail(msg->parts);
                while(elem!=NULL) {
                    part = (CMimePart_T *)cmime_list_data(elem);
                    match = 0;
                    if (part->parent_boundary!=NULL) {
                        if (strncmp(part->parent_boundary,boundary,strlen(part->parent_boundary))==0) 
                            match = 1;
                    }

                    if (part->boundary!=NULL) {
                        if (strncmp(part->boundary,boundary,strlen(part->boundary))==0) 
                            match = 1;
                    }
                    
                    if (match == 1) {
                        if (part->postface!=NULL)
                            free(part->postface);

                        t = (char *)calloc(offset + sizeof(char),sizeof(char));
                        strncpy(t,it,offset);
                        t[strlen(t)] = '\0';
                        part->postface = t;
                        part->last = 1;
                        break;
                   } 
                    
                    elem = elem->prev;
                }
            }
            count++;
            free(info->marker);
            free(info);
            info = NULL;
        }
        
        it++;
    }
    
    if (postface==NULL)
        postface = strdup(s);
    return(postface);
}